

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_mtree.c
# Opt level: O2

void test_write_format_mtree_sub(int dironly)

{
  uint uVar1;
  wchar_t wVar2;
  int iVar3;
  uint uVar4;
  mode_t mVar5;
  archive *paVar6;
  archive_entry *entry;
  time_t v2;
  la_int64_t lVar7;
  time_t tVar8;
  char *pcVar9;
  char *e1;
  longlong lVar10;
  ulong uVar11;
  la_ssize_t v2_00;
  char *pcVar12;
  long lVar13;
  archive_entry *ae;
  int local_4c;
  archive *local_48;
  archive *local_40;
  size_t used;
  
  paVar6 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                   ,L'v',(uint)(paVar6 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  wVar2 = archive_write_set_format_mtree_classic(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'w',0,"ARCHIVE_OK",(long)wVar2,"archive_write_set_format_mtree_classic(a)",
                      paVar6);
  iVar3 = archive_write_set_format_option(paVar6,(char *)0x0,"indent","1");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'y',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_set_format_option(a, NULL, \"indent\", \"1\")",paVar6);
  local_4c = dironly;
  if (dironly != 0) {
    iVar3 = archive_write_set_format_option(paVar6,(char *)0x0,"dironly","1");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,L'|',0,"ARCHIVE_OK",(long)iVar3,
                        "archive_write_set_format_option(a, NULL, \"dironly\", \"1\")",paVar6);
  }
  iVar3 = archive_write_open_memory(paVar6,buff,0xfff,&used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'~',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_open_memory(a, buff, sizeof(buff)-1, &used)",paVar6);
  local_40 = paVar6;
  for (lVar13 = 0x1c; lVar13 != 0x19c; lVar13 = lVar13 + 0x20) {
    local_48 = *(archive **)((long)&entries[0xc].path + lVar13 + 4);
    entry = archive_entry_new();
    ae = entry;
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                     ,L'\x82',(uint)(entry != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    uVar1 = *(uint *)((long)&entries[0xc].mtime + lVar13);
    archive_entry_set_nlink(entry,uVar1);
    uVar4 = archive_entry_nlink(entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,L'\x84',(long)(int)uVar1,"entries[i].nlink",(ulong)uVar4,
                        "archive_entry_nlink(ae)",(void *)0x0);
    tVar8 = *(time_t *)((long)&entries[0xc].mtime + lVar13 + 4);
    archive_entry_set_mtime(entry,tVar8,0);
    v2 = archive_entry_mtime(entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,L'\x86',tVar8,"entries[i].mtime",v2,"archive_entry_mtime(ae)",(void *)0x0);
    uVar1 = *(uint *)((long)&entries[0xc].nlink + lVar13);
    archive_entry_set_mode(entry,uVar1);
    mVar5 = archive_entry_mode(entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,L'\x88',(ulong)uVar1,"entries[i].mode",(ulong)mVar5,
                        "archive_entry_mode(ae)",(void *)0x0);
    uVar11 = (ulong)*(uint *)((long)&entries[0xc].gid + lVar13);
    archive_entry_set_uid(entry,uVar11);
    lVar7 = archive_entry_uid(entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,L'\x8a',uVar11,"entries[i].uid",lVar7,"archive_entry_uid(ae)",(void *)0x0);
    uVar11 = (ulong)*(uint *)((long)&entries[0].path + lVar13);
    archive_entry_set_gid(entry,uVar11);
    lVar7 = archive_entry_gid(entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,L'\x8c',uVar11,"entries[i].gid",lVar7,"archive_entry_gid(ae)",(void *)0x0);
    archive_entry_copy_pathname(entry,(char *)local_48);
    paVar6 = local_40;
    if ((uVar1 & 0xf000) == 0x4000) {
      iVar3 = archive_write_header(local_40,entry);
      v2_00 = (la_ssize_t)iVar3;
      wVar2 = L'\x90';
      lVar10 = 0;
      pcVar9 = "ARCHIVE_OK";
      pcVar12 = "archive_write_header(a, ae)";
    }
    else {
      lVar10 = 8;
      archive_entry_set_size(entry,8);
      paVar6 = local_40;
      iVar3 = archive_write_header(local_40,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                          ,L'\x90',0,"ARCHIVE_OK",(long)iVar3,"archive_write_header(a, ae)",paVar6);
      v2_00 = archive_write_data(paVar6,"Hello012",0xf);
      wVar2 = L'\x93';
      pcVar9 = "8";
      pcVar12 = "archive_write_data(a, \"Hello012\", 15)";
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,wVar2,lVar10,pcVar9,v2_00,pcVar12,paVar6);
    archive_entry_free(entry);
  }
  iVar3 = archive_write_close(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'\x96',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",paVar6);
  iVar3 = archive_write_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'\x97',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
  buff[used] = '\0';
  if (local_4c == 0) {
    pcVar9 = 
    "#mtree\n\n# .\n/set type=file uid=1001 gid=1001 mode=644\n.               time=1231975636.0 mode=755 type=dir\n    COPYING         time=1231975636.0 size=8\n    Makefile        time=1233041050.0 size=8\n    NEWS            time=1231975636.0 size=8\n    PROJECTS        time=1231975636.0 size=8\n    README          time=1231975636.0 size=8\n\n# ./subdir\n/set mode=664\n    subdir          time=1233504586.0 mode=755 type=dir\n        README          time=1231975636.0 uid=1002 size=8\n        config          time=1232266273.0 gid=1003 uid=1003 size=8\n    # ./subdir\n    ..\n\n\n# ./subdir2\n    subdir2         time=1233504586.0 mode=755 type=dir\n    # ./subdir2\n    ..\n\n\n# ./subdir3\n    subdir3         time=1233504586.0 mode=755 type=dir\n        mtree           nlink=2 time=1232266273.0 gid=1003 uid=1003 size=8\n    # ./subdir3\n    ..\n\n..\n\n"
    ;
    pcVar12 = "image";
    wVar2 = L'\x9d';
  }
  else {
    pcVar9 = 
    "#mtree\n# .\n/set type=dir uid=1001 gid=1001 mode=755\n.               time=1231975636.0\n# ./subdir\n    subdir          time=1233504586.0\n    # ./subdir\n    ..\n# ./subdir2\n    subdir2         time=1233504586.0\n    # ./subdir2\n    ..\n# ./subdir3\n    subdir3         time=1233504586.0\n    # ./subdir3\n    ..\n..\n"
    ;
    pcVar12 = "image_dironly";
    wVar2 = L'\x9b';
  }
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
             ,wVar2,buff,"buff",pcVar9,pcVar12,(void *)0x0,L'\0');
  paVar6 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                   ,L'¢',(uint)(paVar6 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar3 = archive_read_support_format_all(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'£',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_format_all(a)",paVar6)
  ;
  iVar3 = archive_read_support_filter_all(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'¤',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_filter_all(a)",paVar6)
  ;
  iVar3 = archive_read_open_memory(paVar6,buff,used);
  local_48 = paVar6;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'¥',0,"ARCHIVE_OK",(long)iVar3,"archive_read_open_memory(a, buff, used)",
                      paVar6);
  for (lVar13 = 0; paVar6 = local_48, lVar13 != 0x180; lVar13 = lVar13 + 0x20) {
    pcVar9 = *(char **)((long)&entries[0].path + lVar13);
    if ((local_4c == 0) || ((*(uint *)((long)&entries[0].mode + lVar13) & 0xf000) == 0x4000)) {
      iVar3 = archive_read_next_header(local_48,&ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                          ,L'«',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",
                          paVar6);
      lVar10 = *(longlong *)((long)&entries[0].mtime + lVar13);
      tVar8 = archive_entry_mtime(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                          ,L'¬',lVar10,"entries[i].mtime",tVar8,"archive_entry_mtime(ae)",
                          (void *)0x0);
      uVar1 = *(uint *)((long)&entries[0].mode + lVar13);
      mVar5 = archive_entry_mode(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                          ,L'­',(ulong)uVar1,"entries[i].mode",(ulong)mVar5,
                          "archive_entry_mode(ae)",(void *)0x0);
      uVar4 = *(uint *)((long)&entries[0].uid + lVar13);
      lVar7 = archive_entry_uid(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                          ,L'®',(ulong)uVar4,"entries[i].uid",lVar7,"archive_entry_uid(ae)",
                          (void *)0x0);
      uVar4 = *(uint *)((long)&entries[0].gid + lVar13);
      lVar7 = archive_entry_gid(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                          ,L'¯',(ulong)uVar4,"entries[i].gid",lVar7,"archive_entry_gid(ae)",
                          (void *)0x0);
      if (lVar13 == 0) {
        pcVar12 = archive_entry_pathname(ae);
        wVar2 = L'µ';
        e1 = "entries[i].path";
      }
      else {
        pcVar9 = pcVar9 + 2;
        pcVar12 = archive_entry_pathname(ae);
        wVar2 = L'²';
        e1 = "entries[i].path + 2";
      }
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                 ,wVar2,pcVar9,e1,pcVar12,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      if ((uVar1 & 0xf000) != 0x4000) {
        lVar7 = archive_entry_size(ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                            ,L'·',8,"8",lVar7,"archive_entry_size(ae)",(void *)0x0);
      }
    }
  }
  iVar3 = archive_read_close(local_48);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'¹',0,"ARCHIVE_OK",(long)iVar3,"archive_read_close(a)",paVar6);
  iVar3 = archive_read_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'º',0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_write_format_mtree_sub(int use_set, int dironly)
{
	struct archive_entry *ae;
	struct archive* a;
	size_t used;
	int i;

	/* Create a mtree format archive. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_mtree(a));
	if (use_set)
		assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, NULL, "use-set", "1"));
	if (dironly)
		assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, NULL, "dironly", "1"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff)-1, &used));

	/* Write entries */
	for (i = 0; entries[i].path != NULL; i++) {
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_set_mtime(ae, entries[i].mtime, 0);
		assert(entries[i].mtime == archive_entry_mtime(ae));
		archive_entry_set_mode(ae, entries[i].mode);
		assert(entries[i].mode == archive_entry_mode(ae));
		archive_entry_set_uid(ae, entries[i].uid);
		assert(entries[i].uid == archive_entry_uid(ae));
		archive_entry_set_gid(ae, entries[i].gid);
		assert(entries[i].gid == archive_entry_gid(ae));
		archive_entry_copy_pathname(ae, entries[i].path);
		if ((entries[i].mode & AE_IFMT) != S_IFDIR)
			archive_entry_set_size(ae, 8);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		if ((entries[i].mode & AE_IFMT) != S_IFDIR)
			assertEqualIntA(a, 8,
			    archive_write_data(a, "Hello012", 15));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
        assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	if (use_set) {
		const char *p;

		buff[used] = '\0';
		assert(NULL != (p = strstr(buff, "\n/set ")));
		if (p != NULL) {
			char *r;
			const char *o;
			p++;
			r = strchr(p, '\n');
			if (r != NULL)
				*r = '\0';
			if (dironly)
				o = "/set type=dir uid=1001 gid=1001 mode=755";
			else
				o = "/set type=file uid=1001 gid=1001 mode=644";
			assertEqualString(o, p);
			if (r != NULL)
				*r = '\n';
		}
	}

	/*
	 * Read the data and check it.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

	/* Read entries */
	for (i = 0; entries[i].path != NULL; i++) {
		if (dironly && (entries[i].mode & AE_IFMT) != S_IFDIR)
			continue;
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualInt(entries[i].mtime, archive_entry_mtime(ae));
		assertEqualInt(entries[i].mode, archive_entry_mode(ae));
		assertEqualInt(entries[i].uid, archive_entry_uid(ae));
		assertEqualInt(entries[i].gid, archive_entry_gid(ae));
		assertEqualString(entries[i].path, archive_entry_pathname(ae));
		if ((entries[i].mode & AE_IFMT) != S_IFDIR)
			assertEqualInt(8, archive_entry_size(ae));
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}